

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int get_twopass_worst_quality
              (AV1_COMP *cpi,double av_frame_err,double inactive_zone,int av_target_bandwidth)

{
  int in_ESI;
  long in_RDI;
  double dVar1;
  double in_XMM1_Qa;
  int q;
  double speed_factor;
  double size_factor;
  int rate_err_tol;
  uint64_t target_norm_bits_per_mb;
  double av_err_per_mb;
  int active_mbs;
  int num_mbs;
  RateControlCfg *rc_cfg;
  AV1EncoderConfig *oxcf;
  RATE_CONTROL *rc;
  double local_a0;
  aom_bit_depth_t aStackY_84;
  int worst_qindex;
  int rate_err_tol_00;
  int iVar2;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  int local_4;
  
  dVar1 = fclamp(in_XMM1_Qa,0.0,0.9999);
  if (in_ESI < 1) {
    local_4 = *(int *)(in_RDI + 0x6082c);
  }
  else {
    if (*(char *)(in_RDI + 0x42408) == '\0') {
      iVar2 = *(int *)(in_RDI + 0x3c190);
    }
    else {
      iVar2 = *(int *)(in_RDI + 0x712fc);
    }
    if (iVar2 - (int)((double)iVar2 * dVar1) < 1) {
      rate_err_tol_00 = 1;
    }
    else {
      rate_err_tol_00 = iVar2 - (int)((double)iVar2 * dVar1);
    }
    if (*(int *)(in_RDI + 0x423c8) < *(int *)(in_RDI + 0x423cc)) {
      worst_qindex = *(int *)(in_RDI + 0x423c8);
    }
    else {
      worst_qindex = *(int *)(in_RDI + 0x423cc);
    }
    if (rate_err_tol_00 < 500) {
      aStackY_84 = 0x3fed9999;
    }
    else {
      aStackY_84 = 0x3ff0cccc;
      if (rate_err_tol_00 < 0xbb9) {
        aStackY_84 = 0x3ff00000;
      }
    }
    if ((double)*(int *)(in_RDI + 0x4272c) * 0.005 + 0.975 <= 1.02) {
      local_a0 = (double)*(int *)(in_RDI + 0x4272c) * 0.005 + 0.975;
    }
    else {
      local_a0 = 1.02;
    }
    iVar3 = worst_qindex;
    twopass_update_bpm_factor((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff8c,iVar2),rate_err_tol_00)
    ;
    local_4 = find_qindex_by_rate_with_correction
                        (CONCAT44(iVar3,in_stack_ffffffffffffffa0),aStackY_84,local_a0,
                         (double)CONCAT44(in_stack_ffffffffffffff8c,iVar2),rate_err_tol_00,
                         worst_qindex);
    if ((*(int *)(in_RDI + 0x423dc) == 2) && (local_4 <= *(int *)(in_RDI + 0x423d8))) {
      local_4 = *(int *)(in_RDI + 0x423d8);
    }
  }
  return local_4;
}

Assistant:

static int get_twopass_worst_quality(AV1_COMP *cpi, const double av_frame_err,
                                     double inactive_zone,
                                     int av_target_bandwidth) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;
  inactive_zone = fclamp(inactive_zone, 0.0, 0.9999);

  if (av_target_bandwidth <= 0) {
    return rc->worst_quality;  // Highest value allowed
  } else {
    const int num_mbs = (oxcf->resize_cfg.resize_mode != RESIZE_NONE)
                            ? cpi->initial_mbs
                            : cpi->common.mi_params.MBs;
    const int active_mbs = AOMMAX(1, num_mbs - (int)(num_mbs * inactive_zone));
    const double av_err_per_mb = av_frame_err / (1.0 - inactive_zone);
    const uint64_t target_norm_bits_per_mb =
        ((uint64_t)av_target_bandwidth << BPER_MB_NORMBITS) / active_mbs;
    int rate_err_tol = AOMMIN(rc_cfg->under_shoot_pct, rc_cfg->over_shoot_pct);
    const double size_factor =
        (active_mbs < 500) ? 0.925 : ((active_mbs > 3000) ? 1.05 : 1.0);
    const double speed_factor =
        AOMMIN(1.02, (0.975 + (0.005 * cpi->oxcf.speed)));

    // Update bpm correction factor based on previous GOP rate error.
    twopass_update_bpm_factor(cpi, rate_err_tol);

    // Try and pick a max Q that will be high enough to encode the
    // content at the given rate.
    int q = find_qindex_by_rate_with_correction(
        target_norm_bits_per_mb, cpi->common.seq_params->bit_depth,
        av_err_per_mb,
        cpi->ppi->twopass.bpm_factor * speed_factor * size_factor,
        rc->best_quality, rc->worst_quality);

    // Restriction on active max q for constrained quality mode.
    if (rc_cfg->mode == AOM_CQ) q = AOMMAX(q, rc_cfg->cq_level);
    return q;
  }
}